

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR deleteblock(LispPTR base)

{
  LispPTR LAddr;
  LispPTR LAddr_00;
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  int iVar6;
  
  pLVar3 = NativeAligned4FromLAddr(base);
  if ((3 < (ushort)*pLVar3) && (LAddr = pLVar3[1], LAddr != 0)) {
    pLVar4 = NativeAligned4FromLAddr(LAddr);
    LAddr_00 = pLVar3[2];
    pLVar5 = NativeAligned4FromLAddr(LAddr_00);
    uVar1 = *FreeBlockBuckets_word;
    iVar2 = integerlength((uint)(ushort)*pLVar3);
    iVar6 = 0x3c;
    if (iVar2 < 0x1f) {
      iVar6 = iVar2 * 2;
    }
    pLVar3 = NativeAligned4FromLAddr(iVar6 + (uVar1 & 0xfffffff));
    if (LAddr == base) {
      if ((*pLVar3 & 0xfffffff) == base) {
        *pLVar3 = 0;
      }
      else {
        error("GC error:deleting last list # FREEBLOCKLIST\n");
      }
    }
    else {
      if ((*pLVar3 & 0xfffffff) == base) {
        *pLVar3 = LAddr;
      }
      pLVar4[2] = LAddr_00;
      pLVar5[1] = LAddr;
    }
  }
  return 0;
}

Assistant:

LispPTR deleteblock(LispPTR base) {
  struct arrayblock *bbase, *fbbase, *bbbase;
  LispPTR fwd, bkwd, fbl, freeblocklsp;
  LispPTR *freeblock;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  if ((bbase->arlen >= MINARRAYBLOCKSIZE) && (bbase->fwd != NIL)) {
    fwd = bbase->fwd;
    fbbase = (struct arrayblock *)NativeAligned4FromLAddr(fwd);
    bkwd = bbase->bkwd;
    bbbase = (struct arrayblock *)NativeAligned4FromLAddr(bkwd);
    fbl = FreeBlockChainN(bbase->arlen);
    freeblock = (LispPTR *)NativeAligned4FromLAddr(fbl);
    freeblocklsp = POINTERMASK & *freeblock;
    if (base == fwd) {
      if (base == freeblocklsp)
        *freeblock = NIL;
      else
        error("GC error:deleting last list # FREEBLOCKLIST\n");
      return (NIL);
    } else if (base == freeblocklsp)
      *freeblock = fwd;
    fbbase->bkwd = bkwd;
    bbbase->fwd = fwd;
  }
  return (NIL);
}